

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame.c
# Opt level: O0

int quicly_decode_ack_frame(uint8_t **src,uint8_t *end,quicly_ack_frame_t *frame,int is_ack_ecn)

{
  uint64_t uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  int in_ECX;
  ulong *in_RDX;
  uint8_t *in_RSI;
  uint8_t **in_RDI;
  uint64_t ack_range;
  uint64_t gap;
  uint64_t num_gaps;
  uint64_t i;
  ulong local_30;
  
  uVar1 = ptls_decode_quicint(in_RDI,in_RSI);
  *in_RDX = uVar1;
  if (uVar1 != 0xffffffffffffffff) {
    uVar1 = ptls_decode_quicint(in_RDI,in_RSI);
    in_RDX[2] = uVar1;
    if ((((uVar1 != 0xffffffffffffffff) &&
         (uVar1 = ptls_decode_quicint(in_RDI,in_RSI), uVar1 != 0xffffffffffffffff)) &&
        (uVar2 = ptls_decode_quicint(in_RDI,in_RSI), uVar2 != 0xffffffffffffffff)) &&
       (uVar2 <= *in_RDX)) {
      in_RDX[1] = *in_RDX - uVar2;
      in_RDX[4] = uVar2 + 1;
      in_RDX[3] = 0;
      local_30 = 0;
      while( true ) {
        if (local_30 == uVar1) {
          if (in_ECX != 0) {
            for (local_30 = 0; local_30 != 3; local_30 = local_30 + 1) {
              uVar1 = ptls_decode_quicint(in_RDI,in_RSI);
              if (uVar1 == 0xffffffffffffffff) {
                return 0x20007;
              }
            }
          }
          return 0;
        }
        uVar2 = ptls_decode_quicint(in_RDI,in_RSI);
        if (uVar2 == 0xffffffffffffffff) {
          return 0x20007;
        }
        uVar3 = ptls_decode_quicint(in_RDI,in_RSI);
        if (uVar3 == 0xffffffffffffffff) break;
        if (local_30 < 0x100) {
          if (in_RDX[1] < uVar2 + uVar3 + 2) {
            return 0x20007;
          }
          in_RDX[local_30 + 0x105] = uVar2 + 1;
          in_RDX[local_30 + 5] = uVar3 + 1;
          in_RDX[1] = in_RDX[1] - (uVar2 + uVar3 + 2);
          in_RDX[3] = in_RDX[3] + 1;
        }
        local_30 = local_30 + 1;
      }
      return 0x20007;
    }
  }
  return 0x20007;
}

Assistant:

int quicly_decode_ack_frame(const uint8_t **src, const uint8_t *end, quicly_ack_frame_t *frame, int is_ack_ecn)
{
    uint64_t i, num_gaps, gap, ack_range;

    if ((frame->largest_acknowledged = quicly_decodev(src, end)) == UINT64_MAX)
        goto Error;
    if ((frame->ack_delay = quicly_decodev(src, end)) == UINT64_MAX)
        goto Error;
    if ((num_gaps = quicly_decodev(src, end)) == UINT64_MAX)
        goto Error;

    if ((ack_range = quicly_decodev(src, end)) == UINT64_MAX)
        goto Error;
    if (frame->largest_acknowledged < ack_range)
        goto Error;
    frame->smallest_acknowledged = frame->largest_acknowledged - ack_range;
    frame->ack_block_lengths[0] = ack_range + 1;
    frame->num_gaps = 0;

    for (i = 0; i != num_gaps; ++i) {
        if ((gap = quicly_decodev(src, end)) == UINT64_MAX)
            goto Error;
        if ((ack_range = quicly_decodev(src, end)) == UINT64_MAX)
            goto Error;
        if (i < QUICLY_ACK_MAX_GAPS) {
            if (frame->smallest_acknowledged < gap + ack_range + 2)
                goto Error;
            frame->gaps[i] = gap + 1;
            frame->ack_block_lengths[i + 1] = ack_range + 1;
            frame->smallest_acknowledged -= gap + ack_range + 2;
            ++frame->num_gaps;
        }
    }

    if (is_ack_ecn) {
        /* just skip ECT(0), ECT(1), ECT-CE counters for the time being */
        for (i = 0; i != 3; ++i)
            if (quicly_decodev(src, end) == UINT64_MAX)
                goto Error;
    }
    return 0;
Error:
    return QUICLY_TRANSPORT_ERROR_FRAME_ENCODING;
}